

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::solver_equalities_101coeff
          (solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  uint uVar1;
  sparse_matrix<int> *this_00;
  pointer pmVar2;
  pointer pmVar3;
  pointer pfVar4;
  byte bVar5;
  bool bVar6;
  longdouble *plVar7;
  int *piVar8;
  rc_data *prVar9;
  bound_factor *__s;
  undefined8 extraout_RAX;
  long lVar10;
  int iVar11;
  pointer pfVar12;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  
  this_00 = &this->ap;
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  pvVar13 = csts;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(this_00,csts,m_,n_);
  uVar16 = (ulong)(this->ap).m_rows_values.m_length;
  uVar17 = uVar16 << 4;
  plVar7 = (longdouble *)operator_new__(uVar17);
  memset(plVar7,0,uVar17);
  uVar16 = uVar16 << 2;
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar7;
  piVar8 = (int *)operator_new__(uVar16);
  memset(piVar8,0,uVar16);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar8;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3;
  uVar16 = (long)*(pointer *)
                  ((long)&(pmVar3->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar3->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar10 != 0x28) {
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar23 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar24 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar25 = vpbroadcastq_avx512f();
    uVar16 = 0;
    auVar26 = vpbroadcastq_avx512f();
    do {
      auVar27 = vpbroadcastq_avx512f();
      auVar28 = vmovdqa64_avx512f(auVar25);
      vpmullq_avx512dq(auVar21,auVar23);
      uVar16 = uVar16 + 8;
      auVar21 = vpaddq_avx512f(auVar21,auVar24);
      auVar25 = vporq_avx512f(auVar27,auVar22);
      uVar17 = vpcmpuq_avx512f(auVar25,auVar26,2);
      auVar25 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar3->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar13));
      bVar5 = (byte)uVar17;
      auVar27._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * auVar25._8_8_;
      auVar27._0_8_ = (ulong)(bVar5 & 1) * auVar25._0_8_;
      auVar27._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * auVar25._16_8_;
      auVar27._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * auVar25._24_8_;
      auVar27._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * auVar25._32_8_;
      auVar27._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * auVar25._40_8_;
      auVar27._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * auVar25._48_8_;
      auVar27._56_8_ = (uVar17 >> 7) * auVar25._56_8_;
      auVar25 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar13->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar3->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar29._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * auVar25._8_8_;
      auVar29._0_8_ = (ulong)(bVar5 & 1) * auVar25._0_8_;
      auVar29._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * auVar25._16_8_;
      auVar29._24_8_ = (ulong)((byte)(uVar17 >> 3) & 1) * auVar25._24_8_;
      auVar29._32_8_ = (ulong)((byte)(uVar17 >> 4) & 1) * auVar25._32_8_;
      auVar29._40_8_ = (ulong)((byte)(uVar17 >> 5) & 1) * auVar25._40_8_;
      auVar29._48_8_ = (ulong)((byte)(uVar17 >> 6) & 1) * auVar25._48_8_;
      auVar29._56_8_ = (uVar17 >> 7) * auVar25._56_8_;
      auVar25 = vpsubq_avx512f(auVar27,auVar29);
      auVar25 = vpsraq_avx512f(auVar25,3);
      auVar25 = vpmaxuq_avx512f(auVar28,auVar25);
    } while (((lVar10 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar16);
    auVar21 = vmovdqa64_avx512f(auVar25);
    auVar22._0_8_ = (ulong)(bVar5 & 1) * auVar21._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar28._0_8_;
    bVar6 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar22._8_8_ = (ulong)bVar6 * auVar21._8_8_ | (ulong)!bVar6 * auVar28._8_8_;
    bVar6 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar22._16_8_ = (ulong)bVar6 * auVar21._16_8_ | (ulong)!bVar6 * auVar28._16_8_;
    bVar6 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar22._24_8_ = (ulong)bVar6 * auVar21._24_8_ | (ulong)!bVar6 * auVar28._24_8_;
    bVar6 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar22._32_8_ = (ulong)bVar6 * auVar21._32_8_ | (ulong)!bVar6 * auVar28._32_8_;
    bVar6 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar22._40_8_ = (ulong)bVar6 * auVar21._40_8_ | (ulong)!bVar6 * auVar28._40_8_;
    bVar6 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar22._48_8_ = (ulong)bVar6 * auVar21._48_8_ | (ulong)!bVar6 * auVar28._48_8_;
    auVar22._56_8_ = (uVar17 >> 7) * auVar21._56_8_ | (ulong)!SUB81(uVar17 >> 7,0) * auVar28._56_8_;
    auVar20 = vextracti64x4_avx512f(auVar22,1);
    auVar21 = vpmaxuq_avx512f(auVar22,ZEXT3264(auVar20));
    auVar18 = vpmaxuq_avx512vl(auVar21._0_16_,auVar21._16_16_);
    auVar19 = vpshufd_avx(auVar18,0xee);
    auVar19 = vpmaxuq_avx512vl(auVar18,auVar19);
    uVar16 = auVar19._0_8_;
  }
  uVar16 = -(ulong)(uVar16 >> 0x3b != 0) | uVar16 << 5;
  prVar9 = (rc_data *)operator_new__(uVar16);
  memset(prVar9,0,uVar16);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
  ._M_head_impl = prVar9;
  uVar16 = (long)m_ * 8;
  if (m_ < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  __s = (bound_factor *)operator_new__(uVar16);
  memset(__s,0,uVar16);
  uVar16 = (long)m_ << 4;
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
  ._M_head_impl = __s;
  if (m_ < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  plVar7 = (longdouble *)operator_new__(uVar16);
  iVar11 = 0;
  memset(plVar7,0,uVar16);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar7;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    uVar16 = 0;
    pmVar3 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      __s[uVar16].negative_factor = 0;
      pmVar2 = pmVar3 + uVar16;
      iVar15 = pmVar2->min;
      __s[uVar16].value = iVar15;
      pfVar12 = *(pointer *)
                 &(pmVar2->elements).
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar4 = *(pointer *)
                ((long)&(pmVar2->elements).
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar12 != pfVar4) {
        iVar15 = 0;
        piVar14 = piVar8 + iVar11;
        do {
          uVar1 = pfVar12->factor + 1;
          this = (solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                  *)(ulong)uVar1;
          if ((uVar1 & 0xfffffffd) != 0) {
            itm::solver_equalities_101coeff();
            goto LAB_0035042c;
          }
          *piVar14 = pfVar12->factor;
          if (pfVar12->factor < 0) {
            iVar15 = iVar15 + 1;
            __s[uVar16].negative_factor = iVar15;
          }
          pfVar12 = pfVar12 + 1;
          piVar14 = piVar14 + 1;
          iVar11 = iVar11 + 1;
        } while (pfVar12 != pfVar4);
        iVar15 = pmVar2->min;
      }
      if (iVar15 != pmVar2->max) {
LAB_0035042c:
        itm::solver_equalities_101coeff();
        operator_delete__(__s);
        (this->b)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
        ._M_head_impl = (bound_factor *)0x0;
        prVar9 = (this->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
                 ._M_head_impl;
        if (prVar9 != (rc_data *)0x0) {
          operator_delete__(prVar9);
        }
        (this->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        piVar8 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (piVar8 != (int *)0x0) {
          operator_delete__(piVar8);
        }
        (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        plVar7 = (this->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        if (plVar7 != (longdouble *)0x0) {
          operator_delete__(plVar7);
        }
        (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
        super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
        super__Head_base<0UL,_long_double_*,_false>._M_head_impl = (longdouble *)0x0;
        sparse_matrix<int>::~sparse_matrix(this_00);
        _Unwind_Resume(extraout_RAX);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)m_);
  }
  return;
}

Assistant:

solver_equalities_101coeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0; i != m; ++i) {
            b[i].negative_factor = 0;
            b[i].value = csts[i].min;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor < 0)
                    ++b[i].negative_factor;
            }

            bx_ensures(csts[i].min == csts[i].max);
        }
    }